

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.h
# Opt level: O3

void __thiscall
cfd::core::DescriptorKeyReference::~DescriptorKeyReference(DescriptorKeyReference *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  pcVar1 = (this->argument_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->argument_).field_2) {
    operator_delete(pcVar1);
  }
  KeyData::~KeyData(&this->key_data_);
  puVar2 = (this->extpubkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).privkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT DescriptorKeyReference {
 public:
  /**
   * @brief constructor.
   */
  DescriptorKeyReference();
  /**
   * @brief constructor.
   * @param[in] pubkey      pubkey
   */
  explicit DescriptorKeyReference(const Pubkey& pubkey);
  /**
   * @brief constructor.
   * @param[in] pubkey      schnorr pubkey
   */
  explicit DescriptorKeyReference(const SchnorrPubkey& pubkey);
  /**
   * @brief constructor.
   * @param[in] ext_privkey   ext privkey
   * @param[in] arg           argument
   */
  explicit DescriptorKeyReference(
      const ExtPrivkey& ext_privkey, const std::string* arg = nullptr);
  /**
   * @brief constructor.
   * @param[in] ext_pubkey   ext pubkey
   * @param[in] arg           argument
   */
  explicit DescriptorKeyReference(
      const ExtPubkey& ext_pubkey, const std::string* arg = nullptr);
  /**
   * @brief constructor.
   * @param[in] key      key data
   * @param[in] arg      argument
   */
  explicit DescriptorKeyReference(
      const KeyData& key, const std::string* arg = nullptr);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorKeyReference object
   */
  DescriptorKeyReference(const DescriptorKeyReference& object);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorKeyReference object
   * @return DescriptorKeyReference object
   */
  DescriptorKeyReference& operator=(const DescriptorKeyReference& object);

  /**
   * @brief getting pubkey.
   * @return pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief getting schnorr pubkey.
   * @return pubkey
   */
  SchnorrPubkey GetSchnorrPubkey() const;
  /**
   * @brief getting argument.
   * @return argument
   */
  std::string GetArgument() const;
  /**
   * @brief exist ext-privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPrivkey() const;
  /**
   * @brief exist ext-pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPubkey() const;
  /**
   * @brief exist schnorr pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasSchnorrPubkey() const;
  /**
   * @brief getting ext-privkey.
   * @details need ext-privkey exists.
   * @return ext-privkey
   */
  ExtPrivkey GetExtPrivkey() const;
  /**
   * @brief getting ext-pubkey.
   * @details need ext-pubkey exists.
   * @return ext-pubkey
   */
  ExtPubkey GetExtPubkey() const;
  /**
   * @brief getting key data.
   * @return key data
   */
  KeyData GetKeyData() const;
  /**
   * @brief getting key type.
   * @return key type
   */
  DescriptorKeyType GetKeyType() const;

 private:
  DescriptorKeyType key_type_;    //!< node key type
  SchnorrPubkey schnorr_pubkey_;  //!< schnorr pubkey
  Pubkey pubkey_;                 //!< pubkey
  ExtPrivkey extprivkey_;         //!< ext privkey
  ExtPubkey extpubkey_;           //!< ext pubkey
  KeyData key_data_;              //!< key data
  std::string argument_;          //!< argument
}